

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# json.cpp
# Opt level: O2

void __thiscall json::Value::stringify(Value *this,ostream *os,bool pretty)

{
  pointer pRVar1;
  bool bVar2;
  IString *pIVar3;
  ArrayStorage *pAVar4;
  char *in_RCX;
  Ref *item;
  pointer pRVar5;
  string_view str;
  string_view str_00;
  stringstream local_1d8 [8];
  stringstream wtf16;
  String local_1c8 [376];
  size_t local_50;
  ostream *local_48;
  
  if (this->type == Array) {
    std::operator<<(os,'[');
    pAVar4 = getArray(this);
    pRVar1 = (pAVar4->super__Vector_base<json::Value::Ref,_std::allocator<json::Value::Ref>_>).
             _M_impl.super__Vector_impl_data._M_finish;
    bVar2 = true;
    for (pRVar5 = (pAVar4->super__Vector_base<json::Value::Ref,_std::allocator<json::Value::Ref>_>).
                  _M_impl.super__Vector_impl_data._M_start; pRVar5 != pRVar1; pRVar5 = pRVar5 + 1) {
      if (!bVar2) {
        std::operator<<(os,',');
      }
      stringify((pRVar5->super_shared_ptr<json::Value>).
                super___shared_ptr<json::Value,_(__gnu_cxx::_Lock_policy)2>._M_ptr,os,pretty);
      bVar2 = false;
    }
    std::operator<<(os,']');
    return;
  }
  if (this->type == String) {
    std::__cxx11::stringstream::stringstream(local_1d8);
    pIVar3 = getIString(this);
    str._M_str = in_RCX;
    str._M_len = (size_t)(pIVar3->str)._M_str;
    bVar2 = ::wasm::String::convertWTF8ToWTF16(local_1c8,(ostream *)(pIVar3->str)._M_len,str);
    if (bVar2) {
      std::__cxx11::stringbuf::str();
      str_00._M_str = in_RCX;
      str_00._M_len = local_50;
      ::wasm::String::printEscapedJSON((String *)os,local_48,str_00);
      std::__cxx11::string::~string((string *)&local_50);
      std::__cxx11::stringstream::~stringstream(local_1d8);
      return;
    }
    __assert_fail("valid",
                  "/workspace/llm4binary/github/license_c_cmakelists/WebAssembly[P]binaryen/src/support/json.cpp"
                  ,0x1b,"void json::Value::stringify(std::ostream &, bool)");
  }
  ::wasm::handle_unreachable
            ("TODO: stringify all of JSON",
             "/workspace/llm4binary/github/license_c_cmakelists/WebAssembly[P]binaryen/src/support/json.cpp"
             ,0x2c);
}

Assistant:

void Value::stringify(std::ostream& os, bool pretty) {
  if (isString()) {
    std::stringstream wtf16;
    [[maybe_unused]] bool valid =
      wasm::String::convertWTF8ToWTF16(wtf16, getIString().str);
    assert(valid);
    // TODO: Use wtf16.view() once we have C++20.
    wasm::String::printEscapedJSON(os, wtf16.str());
  } else if (isArray()) {
    os << '[';
    auto first = true;
    for (auto& item : getArray()) {
      if (first) {
        first = false;
      } else {
        // TODO pretty whitespace
        os << ',';
      }
      item->stringify(os, pretty);
    }
    os << ']';
  } else {
    WASM_UNREACHABLE("TODO: stringify all of JSON");
  }
}